

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_newell_normal(float *normal,int num_vert,float **vert,int normalize)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  double dVar4;
  float *v;
  float *u;
  float p;
  int j;
  int i;
  int normalize_local;
  float **vert_local;
  int num_vert_local;
  float *normal_local;
  
  normal[2] = 0.0;
  normal[1] = 0.0;
  *normal = 0.0;
  p = (float)(num_vert + -1);
  for (u._4_4_ = 0.0; (int)u._4_4_ < num_vert; u._4_4_ = (float)((int)u._4_4_ + 1)) {
    pfVar1 = vert[(int)p];
    pfVar2 = vert[(int)u._4_4_];
    *normal = (pfVar1[1] - pfVar2[1]) * (pfVar1[2] + pfVar2[2]) + *normal;
    normal[1] = (pfVar1[2] - pfVar2[2]) * (*pfVar1 + *pfVar2) + normal[1];
    normal[2] = (*pfVar1 - *pfVar2) * (pfVar1[1] + pfVar2[1]) + normal[2];
    p = u._4_4_;
  }
  if (normalize != 0) {
    dVar4 = sqrt((double)(normal[2] * normal[2] + *normal * *normal + normal[1] * normal[1]));
    fVar3 = (float)(1.0 / dVar4);
    *normal = fVar3 * *normal;
    normal[1] = fVar3 * normal[1];
    normal[2] = fVar3 * normal[2];
  }
  return;
}

Assistant:

void stb_newell_normal(float *normal, int num_vert, float **vert, int normalize)
{
   int i,j;
   float p;
   normal[0] = normal[1] = normal[2] = 0;
   for (i=num_vert-1,j=0; j < num_vert; i=j++) {
      float *u = vert[i];
      float *v = vert[j];
      normal[0] += (u[1] - v[1]) * (u[2] + v[2]);
      normal[1] += (u[2] - v[2]) * (u[0] + v[0]);
      normal[2] += (u[0] - v[0]) * (u[1] + v[1]);
   }
   if (normalize) {
      p = normal[0]*normal[0] + normal[1]*normal[1] + normal[2]*normal[2];
      p = (float) (1.0 / sqrt(p));
      normal[0] *= p;
      normal[1] *= p;
      normal[2] *= p;
   }
}